

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggwave.cpp
# Opt level: O1

int ggwave_decode(ggwave_Instance id,void *waveformBuffer,int waveformSize,void *payloadBuffer)

{
  GGWave *this;
  bool bVar1;
  undefined8 *puVar2;
  uint uVar3;
  
  this = (GGWave *)(&(anonymous_namespace)::g_instances)[id];
  bVar1 = GGWave::decode(this,waveformBuffer,waveformSize);
  if (bVar1) {
    puVar2 = (undefined8 *)__tls_get_addr(&PTR_0010ffb8);
    if (*(char *)(puVar2 + 2) == '\0') {
      ggwave_decode_cold_1();
    }
    uVar3 = (this->m_rx).dataLength;
    if (uVar3 == 0) {
      uVar3 = 0;
    }
    else {
      (this->m_rx).dataLength = 0;
      if (uVar3 != 0xffffffff) {
        *puVar2 = (this->m_rx).data.m_data;
        *(uint *)(puVar2 + 1) = uVar3;
      }
    }
    if (uVar3 == 0xffffffff) {
      uVar3 = 0xffffffff;
    }
    else if (0 < (int)uVar3) {
      memcpy(payloadBuffer,(void *)*puVar2,(ulong)uVar3);
    }
  }
  else {
    uVar3 = 0xffffffff;
    if ((anonymous_namespace)::g_fptr != (FILE *)0x0) {
      fprintf((anonymous_namespace)::g_fptr,"Failed to decode data - GGWave instance %d\n",
              (ulong)(uint)id);
    }
  }
  return uVar3;
}

Assistant:

int ggwave_decode(
        ggwave_Instance id,
        const void * waveformBuffer,
        int waveformSize,
        void * payloadBuffer) {
    GGWave * ggWave = (GGWave *) g_instances[id];

    if (ggWave->decode(waveformBuffer, waveformSize) == false) {
        ggprintf("Failed to decode data - GGWave instance %d\n", id);
        return -1;
    }

    static thread_local GGWave::TxRxData data;

    const auto dataLength = ggWave->rxTakeData(data);
    if (dataLength == -1) {
        // failed to decode message
        return -1;
    } else if (dataLength > 0) {
        memcpy(payloadBuffer, data.data(), dataLength);
    }

    return dataLength;
}